

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O3

WasmSplitOptions * __thiscall
wasm::WasmSplitOptions::add
          (WasmSplitOptions *this,string *longName,string *shortName,string *description,
          string *category,Arguments arguments,Action *action)

{
  undefined4 in_register_0000008c;
  long lVar1;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_68;
  undefined8 local_48;
  string *local_40;
  string *local_38;
  
  local_48 = CONCAT44(in_register_0000008c,arguments);
  lVar1 = 0x378;
  local_40 = category;
  local_38 = description;
  do {
    local_68.
    super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(this->super_ToolOptions)._vptr_ToolOptions + lVar1);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_68.
                  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>
                  ._M_impl.super__Vector_impl_data._M_start,longName,&local_68);
    lVar1 = lVar1 + 0x38;
  } while (lVar1 != 0x490);
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add(this,longName,shortName,local_38,local_40,&local_68,(Arguments)local_48,action);
  return this;
}

Assistant:

WasmSplitOptions& WasmSplitOptions::add(const std::string& longName,
                                        const std::string& shortName,
                                        const std::string& description,
                                        const std::string& category,
                                        Arguments arguments,
                                        const Action& action) {
  // Add an option valid in all modes.
  for (unsigned i = 0; i < NumModes; ++i) {
    validOptions[i].insert(longName);
  }
  return add(longName, shortName, description, category, {}, arguments, action);
}